

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O0

Var Js::JavascriptDate::EntryToJSON(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  anon_class_24_3_45d37546 implicitCall;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  Var *values;
  undefined4 *puVar6;
  Var pvVar7;
  JavascriptLibrary *this;
  PropertyRecord *this_00;
  char16 *varName;
  RecyclableObject *pRVar8;
  double value;
  RecyclableObject *toISOFunc;
  Var toISO;
  Var num;
  Var result;
  RecyclableObject *thisObj;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  pTVar5 = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x4fc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  thisObj = (RecyclableObject *)RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                ,0x4ff,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError((ScriptContext *)thisObj,-0x7ff5ec41,L"Data.prototype.toJSON");
  }
  result = (Var)0x0;
  pvVar7 = Arguments::operator[]((Arguments *)&scriptContext,0);
  BVar3 = JavascriptConversion::ToObject
                    (pvVar7,(ScriptContext *)thisObj,(RecyclableObject **)&result);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError((ScriptContext *)thisObj,-0x7ff5ec42,L"Date.prototype.toJSON");
  }
  num = (Var)0x0;
  BVar3 = TryInvokeRemotely(EntryToJSON,(ScriptContext *)thisObj,(Arguments *)&scriptContext,&num);
  if (BVar3 == 0) {
    pvVar7 = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)2>
                       (result,(ScriptContext *)thisObj);
    bVar2 = JavascriptNumber::Is(pvVar7);
    if (bVar2) {
      value = JavascriptNumber::GetValue(pvVar7);
      bVar2 = NumberUtilities::IsFinite(value);
      if (!bVar2) {
        this = ScriptContext::GetLibrary((ScriptContext *)thisObj);
        pRVar8 = JavascriptLibraryBase::GetNull(&this->super_JavascriptLibraryBase);
        return pRVar8;
      }
    }
    pvVar7 = Js::JavascriptOperators::GetProperty
                       ((RecyclableObject *)result,0x16e,(ScriptContext *)thisObj,
                        (PropertyValueInfo *)0x0);
    bVar2 = JavascriptConversion::IsCallable(pvVar7);
    pRVar8 = thisObj;
    if (!bVar2) {
      this_00 = ScriptContext::GetPropertyName((ScriptContext *)thisObj,0x16e);
      varName = PropertyRecord::GetBuffer(this_00);
      JavascriptError::ThrowTypeError((ScriptContext *)pRVar8,-0x7ff5ec45,varName);
    }
    pRVar8 = VarTo<Js::RecyclableObject>(pvVar7);
    pTVar5 = ScriptContext::GetThreadContext((ScriptContext *)thisObj);
    implicitCall.toISOFunc = pRVar8;
    implicitCall.scriptContext = (ScriptContext *)thisObj;
    implicitCall.thisObj = (RecyclableObject *)result;
    callInfo_local =
         (CallInfo)
         ThreadContext::
         ExecuteImplicitCall<Js::JavascriptDate::EntryToJSON(Js::RecyclableObject*,Js::CallInfo,___)::__0>
                   (pTVar5,pRVar8,ImplicitCall_Accessor,implicitCall);
  }
  else {
    callInfo_local = (CallInfo)num;
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptDate::EntryToJSON(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Data.prototype.toJSON"));
        }
        RecyclableObject* thisObj = nullptr;
        if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &thisObj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Date.prototype.toJSON"));
        }

        Var result = nullptr;
        if (TryInvokeRemotely(EntryToJSON, scriptContext, args, &result))
        {
            return result;
        }

        Var num = JavascriptConversion::ToPrimitive<JavascriptHint::HintNumber>(thisObj, scriptContext);
        if (JavascriptNumber::Is(num)
            && !NumberUtilities::IsFinite(JavascriptNumber::GetValue(num)))
        {
            return scriptContext->GetLibrary()->GetNull();
        }

        Var toISO = JavascriptOperators::GetProperty(thisObj, PropertyIds::toISOString, scriptContext, NULL);
        if (!JavascriptConversion::IsCallable(toISO))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::toISOString)->GetBuffer());
        }
        RecyclableObject* toISOFunc = VarTo<RecyclableObject>(toISO);
        return scriptContext->GetThreadContext()->ExecuteImplicitCall(toISOFunc, Js::ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(scriptContext->GetThreadContext(), toISOFunc, CallInfo(1), thisObj);
        });
    }